

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

bool __thiscall
OpenMesh::PolyConnectivity::is_collapse_ok(PolyConnectivity *this,HalfedgeHandle v0v1)

{
  VertexHandle _vh;
  VertexHandle _vh_00;
  BaseHandle BVar1;
  BaseHandle BVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  value_type vVar7;
  reference pvVar8;
  Halfedge *pHVar9;
  Vertex *pVVar10;
  char cVar11;
  HalfedgeHandle HVar12;
  HalfedgeHandle HVar13;
  bool bVar14;
  undefined1 local_50 [8];
  VertexVertexIter vv_it;
  
  pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)((int)v0v1.super_BaseHandle.idx_ >> 1));
  if ((pvVar8->status_ & 1) == 0) {
    HVar12.super_BaseHandle.idx_ =
         (BaseHandle)
         ((-((uint)v0v1.super_BaseHandle.idx_ & 1) | 1) + (int)v0v1.super_BaseHandle.idx_);
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
    _vh.super_BaseHandle.idx_ =
         (BaseHandle)(pHVar9->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
    _vh_00.super_BaseHandle.idx_ =
         (BaseHandle)(pHVar9->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
    if ((pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) {
      bVar14 = false;
    }
    else {
      pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
      uVar5 = valence(this,(FaceHandle)
                           (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_)
      ;
      bVar14 = uVar5 == 3;
    }
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
    if ((pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) {
      vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0;
    }
    else {
      pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
      uVar5 = valence(this,(FaceHandle)
                           (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_)
      ;
      vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._21_3_ = (int3)(uVar5 >> 8);
      vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_1_ = uVar5 == 3;
    }
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
    pHVar9 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,
                        (HalfedgeHandle)
                        (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle
                        .idx_);
    BVar1.idx_ = (pHVar9->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
    pHVar9 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,
                        (HalfedgeHandle)
                        (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle
                        .idx_);
    BVar2.idx_ = (pHVar9->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       ((BaseKernel *)this,
                        (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->super_ArrayKernel).vertex_status_.
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_,(VertexHandle)_vh.super_BaseHandle.idx_);
    if (((pvVar8->status_ & 1) == 0) &&
       (pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                           ((BaseKernel *)this,
                            (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                            (this->super_ArrayKernel).vertex_status_.
                            super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle
                            .idx_,_vh_00), (pvVar8->status_ & 1) == 0)) {
      pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
      if (bVar14 && (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1)
      {
        pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
        HVar13.super_BaseHandle.idx_ =
             (BaseHandle)
             (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar13);
        uVar3 = (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar9 = ArrayKernel::halfedge
                           (&this->super_ArrayKernel,
                            (HalfedgeHandle)
                            ((-((uint)HVar13.super_BaseHandle.idx_ & 1) | 1) +
                            (int)HVar13.super_BaseHandle.idx_));
        if (((pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) &&
           (pHVar9 = ArrayKernel::halfedge
                               (&this->super_ArrayKernel,
                                (HalfedgeHandle)((-(uVar3 & 1) | 1) + uVar3)),
           (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
          return false;
        }
      }
      pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
      cVar11 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_1_;
      if ((pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1 &&
          cVar11 == '\x01') {
        pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
        HVar13.super_BaseHandle.idx_ =
             (BaseHandle)
             (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar13);
        uVar3 = (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar9 = ArrayKernel::halfedge
                           (&this->super_ArrayKernel,
                            (HalfedgeHandle)
                            ((-((uint)HVar13.super_BaseHandle.idx_ & 1) | 1) +
                            (int)HVar13.super_BaseHandle.idx_));
        if (((pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) &&
           (pHVar9 = ArrayKernel::halfedge
                               (&this->super_ArrayKernel,
                                (HalfedgeHandle)((-(uVar3 & 1) | 1) + uVar3)),
           (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
          return false;
        }
      }
      bVar4 = is_boundary(this,_vh);
      if ((((!bVar4) ||
           (bVar4 = is_boundary(this,(VertexHandle)_vh_00.super_BaseHandle.idx_), !bVar4)) ||
          (pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1),
          (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) ||
         (pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12),
         (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
        local_50 = (undefined1  [8])0x0;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)0xffffffffffffffff;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_
             = (BaseHandle)0x0;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
             (BaseHandle)0xffffffff;
        pVVar10 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
        iVar6 = (pVVar10->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar6,iVar6);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_50 = (undefined1  [8])this;
        if (iVar6 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar6)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar7 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_50);
            pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_ArrayKernel).vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar7.super_BaseHandle.idx_);
            *(byte *)&pvVar8->status_ = (byte)pvVar8->status_ & 0xdf;
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_50);
            iVar6 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        pVVar10 = ArrayKernel::vertex(&this->super_ArrayKernel,
                                      (VertexHandle)_vh_00.super_BaseHandle.idx_);
        iVar6 = (pVVar10->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar6,iVar6);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_50 = (undefined1  [8])this;
        if (iVar6 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar6)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar7 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_50);
            pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_ArrayKernel).vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar7.super_BaseHandle.idx_);
            *(byte *)&pvVar8->status_ = (byte)pvVar8->status_ | 0x20;
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_50);
            iVar6 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        pVVar10 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
        iVar6 = (pVVar10->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar6,iVar6);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_50 = (undefined1  [8])this;
        if (iVar6 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar6)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar7 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_50);
            pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_ArrayKernel).vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar7.super_BaseHandle.idx_);
            if (((pvVar8->status_ & 0x20) != 0) &&
               ((vVar7 = Iterators::
                         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                      *)local_50),
                (bVar14 & vVar7.super_BaseHandle.idx_ == (BaseHandle)BVar1.idx_) == 0 &&
                (vVar7 = Iterators::
                         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                      *)local_50),
                vVar7.super_BaseHandle.idx_ != (BaseHandle)BVar2.idx_ || cVar11 != '\x01')))) {
              return false;
            }
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_50);
            iVar6 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        if (bVar14 != false) {
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,v0v1);
          HVar13.super_BaseHandle.idx_ =
               (BaseHandle)
               (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar13);
          uVar3 = (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
          HVar13.super_BaseHandle.idx_ =
               (BaseHandle)
               ((-((uint)HVar13.super_BaseHandle.idx_ & 1) | 1) + (int)HVar13.super_BaseHandle.idx_)
          ;
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar13);
          iVar6 = (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
          pHVar9 = ArrayKernel::halfedge
                             (&this->super_ArrayKernel,(HalfedgeHandle)((-(uVar3 & 1) | 1) + uVar3))
          ;
          if (iVar6 == (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_) {
            pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar13);
            uVar5 = valence(this,(FaceHandle)
                                 (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle
                                 .idx_);
            if (uVar5 != 3) {
              return false;
            }
          }
        }
        if (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_1_ != '\0') {
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
          HVar12.super_BaseHandle.idx_ =
               (BaseHandle)
               (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
          uVar3 = (pHVar9->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
          HVar12.super_BaseHandle.idx_ =
               (BaseHandle)
               ((-((uint)HVar12.super_BaseHandle.idx_ & 1) | 1) + (int)HVar12.super_BaseHandle.idx_)
          ;
          pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
          iVar6 = (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
          pHVar9 = ArrayKernel::halfedge
                             (&this->super_ArrayKernel,(HalfedgeHandle)((-(uVar3 & 1) | 1) + uVar3))
          ;
          if (iVar6 == (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_) {
            pHVar9 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar12);
            uVar5 = valence(this,(FaceHandle)
                                 (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle
                                 .idx_);
            if (uVar5 != 3) {
              return false;
            }
          }
        }
        vVar7 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                             *)local_50);
        pvVar8 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                           ((BaseKernel *)this,
                            (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                            (this->super_ArrayKernel).vertex_status_.
                            super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle
                            .idx_,(VertexHandle)vVar7.super_BaseHandle.idx_);
        if (((pvVar8->status_ & 0x20) == 0) ||
           ((bVar14 & vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_1_ &
                      BVar1.idx_ == BVar2.idx_) == 0)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  //is edge already deleteed?
  if (status(edge_handle(v0v1)).deleted())
  {
    return false;
  }

  HalfedgeHandle v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle v0(to_vertex_handle(v1v0));
  VertexHandle v1(to_vertex_handle(v0v1));  

  bool v0v1_triangle = false;
  bool v1v0_triangle = false;
  
  if (!is_boundary(v0v1))
    v0v1_triangle = valence(face_handle(v0v1)) == 3;
  
  if (!is_boundary(v1v0))
    v1v0_triangle = valence(face_handle(v1v0)) == 3;

  //in a quadmesh we dont have the "next" or "previous" vhandle, so we need to look at previous and next on both sides
  //VertexHandle v_01_p = from_vertex_handle(prev_halfedge_handle(v0v1));
  VertexHandle v_01_n = to_vertex_handle(next_halfedge_handle(v0v1));  

  //VertexHandle v_10_p = from_vertex_handle(prev_halfedge_handle(v1v0));
  VertexHandle v_10_n = to_vertex_handle(next_halfedge_handle(v1v0));

  //are the vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
  {
    return false;
  }

  //the edges v1-vl and vl-v0 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v0v1))
  {
    if (v0v1_triangle)
    {
      //VertexHandle vl = to_vertex_handle(next_halfedge_handle(v0v1));

      HalfedgeHandle h1 = next_halfedge_handle(v0v1);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  //the edges v0-vr and vr-v1 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v1v0))
  {
    if (v1v0_triangle)
    {
      //VertexHandle vr = to_vertex_handle(next_halfedge_handle(v1v0));

      HalfedgeHandle h1 = next_halfedge_handle(v1v0);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) && !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;
  
  VertexVertexIter vv_it;
  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(false);
  }

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(true);
  }

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    if (status(*vv_it).tagged() &&
      !(*vv_it == v_01_n && v0v1_triangle) &&
      !(*vv_it == v_10_n && v1v0_triangle)
      )
    {
      return false;
    }
  }
  
  //test for a face on the backside/other side that might degenerate
  if (v0v1_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v0v1);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }
  
  if (v1v0_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v1v0);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }

  if (status(*vv_it).tagged() && v_01_n == v_10_n && v0v1_triangle && v1v0_triangle)
  {
    return false;
  }

  // passed all tests
  return true;
}